

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFile
          (ModelLoader *this,string *filename,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *removedJointPositions,string *filetype,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *packageDirs)

{
  bool bVar1;
  byte bVar2;
  pointer pMVar3;
  unordered_map *in_RCX;
  vector *in_RDX;
  Model _modelReduced;
  Model _modelFull;
  bool parsingCorrect;
  Model local_2a0 [224];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  ModelLoader *in_stack_fffffffffffffe58;
  Model *in_stack_fffffffffffffe88;
  ModelLoaderPimpl *in_stack_fffffffffffffe90;
  bool local_1;
  
  bVar1 = loadModelFromFile(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                            in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (bVar1) {
    pMVar3 = std::
             unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
             ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                           *)0x188908);
    iDynTree::Model::Model((Model *)&stack0xfffffffffffffe90,&pMVar3->m_model);
    iDynTree::Model::Model(local_2a0);
    iDynTree::Model::setPackageDirs((vector *)local_2a0);
    bVar2 = iDynTree::createReducedModel((Model *)&stack0xfffffffffffffe90,in_RDX,local_2a0,in_RCX);
    if ((bVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      std::
      unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
      ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                    *)0x1889bd);
      local_1 = ModelLoaderPimpl::setModel(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    iDynTree::Model::~Model(local_2a0);
    iDynTree::Model::~Model((Model *)&stack0xfffffffffffffe90);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ModelLoader::loadReducedModelFromFile(const std::string filename,
                                               const std::vector< std::string >& consideredJoints,
                                               const std::unordered_map<std::string, double>& removedJointPositions,
                                               const std::string filetype,
                                               const std::vector<std::string>& packageDirs /*= {}*/)
    {
        bool parsingCorrect = loadModelFromFile(filename, filetype, packageDirs);
        if (!parsingCorrect) return false;
        Model _modelFull = m_pimpl->m_model, _modelReduced;
        _modelReduced.setPackageDirs(packageDirs);

        parsingCorrect = createReducedModel(_modelFull,consideredJoints,_modelReduced,removedJointPositions);

        if (!parsingCorrect)
        {
            return false;
        }

        return m_pimpl->setModel(_modelReduced);
    }